

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_char(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          char_type value)

{
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar1;
  size_t in_RCX;
  void *in_RDX;
  char_writer local_29;
  buffer<char> *local_28;
  char_type local_11;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *paStack_10;
  char_type value_local;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_local;
  
  local_11 = value;
  paStack_10 = this;
  if (this->specs_ == (format_specs *)0x0) {
    write(this,(int)value,in_RDX,in_RCX);
  }
  else {
    local_28 = (this->out_).container;
    local_29.value = value;
    bVar1 = write_padded<(fmt::v6::align::type)1,std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::char_writer>
                      (local_28,this->specs_,1,&local_29);
    (this->out_).container = bVar1.container;
  }
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      out_ = write_padded(out_, *specs_, 1, char_writer{value});
    else
      write(value);
  }